

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O1

UnsupportedError * __thiscall
mp::MakeUnsupportedError
          (UnsupportedError *__return_storage_ptr__,mp *this,CStringRef format_str,ArgList args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  BasicWriter<char> local_250;
  Buffer<char> local_240;
  char local_220 [504];
  
  local_250.buffer_ = &local_240;
  local_250._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_00447498;
  local_240.size_ = 0;
  local_240.capacity_ = 500;
  local_240._vptr_Buffer = (_func_int **)&PTR_grow_00447500;
  local_240.ptr_ = local_220;
  fmt::BasicWriter<char>::write(&local_250,(int)this,format_str.data_,args.types_);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_270,(local_250.buffer_)->ptr_,
             (local_250.buffer_)->ptr_ + (local_250.buffer_)->size_);
  local_250._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_00447498;
  local_240._vptr_Buffer = (_func_int **)&PTR_grow_00447500;
  if (local_240.ptr_ != local_220) {
    operator_delete(local_240.ptr_,local_240.capacity_);
  }
  UnsupportedError::UnsupportedError<std::__cxx11::string>
            (__return_storage_ptr__,(CStringRef)0x38167f,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline UnsupportedError MakeUnsupportedError(
    fmt::CStringRef format_str, fmt::ArgList args) {
  return UnsupportedError("unsupported: {}", fmt::format(format_str, args));
}